

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

void tag_nbviterbi(mdl_t *mdl,seq_t *seq,uint32_t N,uint32_t **out,double *sc,double **psc)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  double *vpsi_00;
  void *__ptr;
  mdl_t *mdl_00;
  ulong uVar8;
  ulong uVar9;
  void *__ptr_00;
  void *__ptr_01;
  double *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  seq_t *in_stack_fffffffffffffef8;
  undefined4 local_e0;
  uint32_t y_2;
  uint32_t yp_1;
  uint32_t t_1;
  uint32_t d_3;
  uint32_t bst;
  uint32_t n_5;
  uint32_t n_4;
  uint32_t n_3;
  uint32_t idx;
  uint32_t i;
  uint32_t n_2;
  uint32_t *bk;
  uint local_a8;
  uint32_t n_1;
  uint32_t d_2;
  uint32_t yp;
  unsigned_long __vla_expr0;
  uint local_8c;
  uint local_88;
  uint32_t y_1;
  uint32_t d_1;
  uint32_t t;
  uint32_t n;
  uint32_t d;
  uint32_t y;
  int op;
  double *old;
  double *cur;
  uint32_t_0__0_ *back;
  double_0__0__0_ *psi;
  uint32_t *vback;
  double *vpsi;
  uint32_t T;
  uint32_t Y;
  double **psc_local;
  double *sc_local;
  uint32_t **out_local;
  uint32_t N_local;
  seq_t *seq_local;
  mdl_t *mdl_local;
  
  uVar3 = mdl->nlbl;
  uVar4 = seq->len;
  vpsi_00 = xvm_new(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  __ptr = xmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  mdl_00 = (mdl_t *)(ulong)uVar3;
  uVar8 = (ulong)uVar3;
  uVar9 = (ulong)(uVar3 * N);
  __ptr_00 = xmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  __ptr_01 = xmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (mdl->type == 1) {
    d = tag_memmsc((mdl_t *)CONCAT44(bst,d_3),(seq_t *)CONCAT44(t_1,yp_1),
                   (double *)CONCAT44(y_2,local_e0));
  }
  else if ((mdl->opt->lblpost & 1U) == 0) {
    d = tag_expsc(mdl_00,in_stack_fffffffffffffef8,
                  (double *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  else {
    d = tag_postsc(_d_2,(seq_t *)CONCAT44(n_1,local_a8),(double *)CONCAT44(bk._4_4_,bk._0_4_));
  }
  if ((mdl->opt->force & 1U) != 0) {
    tag_forced(mdl,seq,vpsi_00,d);
  }
  t = 0;
  for (n = 0; n < uVar3; n = n + 1) {
    *(double *)((long)__ptr_00 + (ulong)t * 8) = vpsi_00[n];
    for (d_1 = 1; t = t + 1, d_1 < N; d_1 = d_1 + 1) {
      *(undefined8 *)((long)__ptr_00 + (ulong)t * 8) = 0xffefffffffffffff;
    }
  }
  for (y_1 = 1; y_1 < uVar4; y_1 = y_1 + 1) {
    for (local_88 = 0; local_88 < uVar3 * N; local_88 = local_88 + 1) {
      *(undefined8 *)((long)__ptr_01 + (ulong)local_88 * 8) =
           *(undefined8 *)((long)__ptr_00 + (ulong)local_88 * 8);
    }
    for (local_8c = 0; local_8c < uVar3; local_8c = local_8c + 1) {
      lVar5 = -0x118 - ((ulong)(uVar3 * N) * 8 + 0xf & 0xfffffffffffffff0);
      local_a8 = 0;
      for (n_1 = 0; n_1 < uVar3; n_1 = n_1 + 1) {
        for (bk._4_4_ = 0; bk._4_4_ < N; bk._4_4_ = bk._4_4_ + 1) {
          *(undefined8 *)(&stack0xfffffffffffffee8 + (ulong)local_a8 * 8 + lVar5 + 0x118) =
               *(undefined8 *)((long)__ptr_01 + (ulong)local_a8 * 8);
          if (d == 0) {
            *(double *)(&stack0xfffffffffffffee8 + (ulong)local_a8 * 8 + lVar5 + 0x118) =
                 vpsi_00[(ulong)y_1 * (long)mdl_00 * uVar8 + n_1 * uVar8 + (ulong)local_8c] +
                 *(double *)(&stack0xfffffffffffffee8 + (ulong)local_a8 * 8 + lVar5 + 0x118);
          }
          else {
            *(double *)(&stack0xfffffffffffffee8 + (ulong)local_a8 * 8 + lVar5 + 0x118) =
                 vpsi_00[(ulong)y_1 * (long)mdl_00 * uVar8 + n_1 * uVar8 + (ulong)local_8c] *
                 *(double *)(&stack0xfffffffffffffee8 + (ulong)local_a8 * 8 + lVar5 + 0x118);
          }
          local_a8 = local_a8 + 1;
        }
      }
      lVar6 = (ulong)(local_8c * N) * 4 + y_1 * uVar9 * 4;
      for (idx = 0; n_3 = N, idx < N; idx = idx + 1) {
        *(uint32_t *)((long)__ptr + (ulong)idx * 4 + lVar6) = idx;
      }
      for (; n_3 < N * uVar3; n_3 = n_3 + 1) {
        n_4 = 0;
        for (n_5 = 1; n_5 < N; n_5 = n_5 + 1) {
          if (*(double *)
               (&stack0xfffffffffffffee8 +
               (ulong)*(uint *)((long)__ptr + (ulong)n_5 * 4 + lVar6) * 8 + lVar5 + 0x118) <
              *(double *)
               (&stack0xfffffffffffffee8 +
               (ulong)*(uint *)((long)__ptr + (ulong)n_4 * 4 + lVar6) * 8 + lVar5 + 0x118)) {
            n_4 = n_5;
          }
        }
        if (*(double *)
             (&stack0xfffffffffffffee8 +
             (ulong)*(uint *)((long)__ptr + (ulong)n_4 * 4 + lVar6) * 8 + lVar5 + 0x118) <=
            *(double *)(&stack0xfffffffffffffee8 + (ulong)n_3 * 8 + lVar5 + 0x118) &&
            *(double *)(&stack0xfffffffffffffee8 + (ulong)n_3 * 8 + lVar5 + 0x118) !=
            *(double *)
             (&stack0xfffffffffffffee8 +
             (ulong)*(uint *)((long)__ptr + (ulong)n_4 * 4 + lVar6) * 8 + lVar5 + 0x118)) {
          *(uint32_t *)((long)__ptr + (ulong)n_4 * 4 + lVar6) = n_3;
        }
      }
      for (bst = 0; bst < N; bst = bst + 1) {
        *(undefined8 *)((long)__ptr_00 + (ulong)(local_8c * N + bst) * 8) =
             *(undefined8 *)
              (&stack0xfffffffffffffee8 +
              (ulong)*(uint *)((long)__ptr + (ulong)bst * 4 + lVar6) * 8 + lVar5 + 0x118);
      }
    }
  }
  for (d_3 = 0; d_3 < N; d_3 = d_3 + 1) {
    t_1 = 0;
    for (yp_1 = 1; yp_1 < uVar3 * N; yp_1 = yp_1 + 1) {
      dVar2 = *(double *)((long)__ptr_00 + (ulong)yp_1 * 8);
      pdVar1 = (double *)((long)__ptr_00 + (ulong)t_1 * 8);
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        t_1 = yp_1;
      }
    }
    if (sc != (double *)0x0) {
      sc[d_3] = *(double *)((long)__ptr_00 + (ulong)t_1 * 8);
    }
    *(undefined8 *)((long)__ptr_00 + (ulong)t_1 * 8) = 0xffefffffffffffff;
    for (y_2 = uVar4; y_2 != 0; y_2 = y_2 - 1) {
      if (y_2 == 1) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(uint *)((long)__ptr + (ulong)t_1 * 4 + (y_2 - 1) * uVar9 * 4) / N;
      }
      out[y_2 - 1][d_3] = t_1 / N;
      if (psc != (double **)0x0) {
        psc[y_2 - 1][d_3] =
             vpsi_00[(ulong)(y_2 - 1) * (long)mdl_00 * uVar8 + uVar7 * uVar8 + (ulong)(t_1 / N)];
      }
      t_1 = *(uint32_t *)((long)__ptr + (ulong)t_1 * 4 + (y_2 - 1) * uVar9 * 4);
    }
  }
  free(__ptr_01);
  free(__ptr_00);
  free(__ptr);
  xvm_free(in_stack_fffffffffffffee8);
  return;
}

Assistant:

void tag_nbviterbi(mdl_t *mdl, const seq_t *seq, uint32_t N,
                   uint32_t **out, double sc[], double **psc) {
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	double   *vpsi  = xvm_new(T * Y * Y);
	uint32_t *vback = xmalloc(sizeof(uint32_t) * T * Y * N);
	double   (*psi) [T][Y    ][Y] = (void *)vpsi;
	uint32_t (*back)[T][Y * N]    = (void *)vback;
	double *cur = xmalloc(sizeof(double) * Y * N);
	double *old = xmalloc(sizeof(double) * Y * N);
	// We first compute the scores for each transitions in the lattice of
	// labels.
	int op;
	if (mdl->type == 1)
		op = tag_memmsc(mdl, seq, vpsi);
	else if (mdl->opt->lblpost)
		op = tag_postsc(mdl, seq, (double *)psi);
	else
		op = tag_expsc(mdl, seq, (double *)psi);
	if (mdl->opt->force)
		tag_forced(mdl, seq, vpsi, op);
	// Here also, it's classical but we have to keep the N best paths
	// leading to each nodes of the lattice instead of only the best one.
	// This mean that code is less trivial and the current implementation is
	// not the most efficient way to do this but it works well and is good
	// enough for the moment.
	// We first build the list of all incoming arcs from all paths from all
	// N-best nodes and next select the N-best one. There is a lot of room
	// here for later optimisations if needed.
	for (uint32_t y = 0, d = 0; y < Y; y++) {
		cur[d++] = (*psi)[0][0][y];
		for (uint32_t n = 1; n < N; n++)
			cur[d++] = -DBL_MAX;
	}
	for (uint32_t t = 1; t < T; t++) {
		for (uint32_t d = 0; d < Y * N; d++)
			old[d] = cur[d];
		for (uint32_t y = 0; y < Y; y++) {
			// 1st, build the list of all incoming
			double lst[Y * N];
			for (uint32_t yp = 0, d = 0; yp < Y; yp++) {
				for (uint32_t n = 0; n < N; n++, d++) {
					lst[d] = old[d];
					if (op)
						lst[d] *= (*psi)[t][yp][y];
					else
						lst[d] += (*psi)[t][yp][y];
				}
			}
			// 2nd, init the back with the N first
			uint32_t *bk = &(*back)[t][y * N];
			for (uint32_t n = 0; n < N; n++)
				bk[n] = n;
			// 3rd, search the N highest values
			for (uint32_t i = N; i < N * Y; i++) {
				// Search the smallest current value
				uint32_t idx = 0;
				for (uint32_t n = 1; n < N; n++)
					if (lst[bk[n]] < lst[bk[idx]])
						idx = n;
				// And replace it if needed
				if (lst[i] > lst[bk[idx]])
					bk[idx] = i;
			}
			// 4th, get the new scores
			for (uint32_t n = 0; n < N; n++)
				cur[y * N + n] = lst[bk[n]];
		}
	}
	// Retrieving the best paths is similar to classical Viterbi except that
	// we have to search for the N bet ones and there is N time more
	// possibles starts.
	for (uint32_t n = 0; n < N; n++) {
		uint32_t bst = 0;
		for (uint32_t d = 1; d < Y * N; d++)
			if (cur[d] > cur[bst])
				bst = d;
		if (sc != NULL)
			sc[n] = cur[bst];
		cur[bst] = -DBL_MAX;
		for (uint32_t t = T; t > 0; t--) {
			const uint32_t yp = (t != 1) ? (*back)[t - 1][bst] / N: 0;
			const uint32_t y  = bst / N;
			out[t - 1][n] = y;
			if (psc != NULL)
				psc[t - 1][n] = (*psi)[t - 1][yp][y];
			bst = (*back)[t - 1][bst];
		}
	}
	free(old);
	free(cur);
	free(vback);
	xvm_free(vpsi);
}